

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O2

bool __thiscall NaPetriNet::ask_for_node(NaPetriNet *this,NaPetriNode *pNode,int *pIndex)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  
  uVar3 = 0;
  do {
    iVar1 = (this->pnaNet).nItems;
    if (iVar1 <= (int)uVar3) {
LAB_0014512b:
      return (int)uVar3 < iVar1;
    }
    iVar2 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(&this->pnaNet,(ulong)uVar3);
    if (*(NaPetriNode **)CONCAT44(extraout_var,iVar2) == pNode) {
      if (pIndex != (int *)0x0) {
        *pIndex = uVar3;
      }
      goto LAB_0014512b;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

bool
NaPetriNet::ask_for_node (NaPetriNode* pNode, int *pIndex)
{
    int i;
    for(i = 0; i < pnaNet.count(); ++i){
        if(pNode == pnaNet[i]){
            if(NULL != pIndex){
                *pIndex = i;
            }
            return true;
        }
    }
    return false;
}